

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_value_numbering.cpp
# Opt level: O3

string * __thiscall
mocker::LocalValueNumbering::hash_abi_cxx11_
          (string *__return_storage_ptr__,LocalValueNumbering *this,
          shared_ptr<mocker::ir::Addr> *addr)

{
  _func_int **pp_Var1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  long *plVar5;
  _func_int **pp_Var6;
  size_type *psVar7;
  uint __len;
  _func_int **__val;
  string __str;
  shared_ptr<mocker::ir::IntLiteral> p;
  long *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  long local_58 [2];
  shared_ptr<mocker::ir::Addr> *local_48;
  shared_ptr<mocker::ir::Addr> local_40;
  
  ir::detail::dyc_impl<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>const&>
            (&local_40,(IntLiteral *)addr);
  if (local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    pp_Var1 = local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
              _vptr_Addr;
    __val = (_func_int **)-(long)pp_Var1;
    if (0 < (long)pp_Var1) {
      __val = pp_Var1;
    }
    __len = 1;
    if ((_func_int **)0x9 < __val) {
      pp_Var6 = __val;
      uVar4 = 4;
      do {
        __len = uVar4;
        if (pp_Var6 < (_func_int **)0x64) {
          __len = __len - 2;
          goto LAB_00169dfd;
        }
        if (pp_Var6 < (_func_int **)0x3e8) {
          __len = __len - 1;
          goto LAB_00169dfd;
        }
        if (pp_Var6 < (_func_int **)0x2710) goto LAB_00169dfd;
        bVar2 = (_func_int **)0x1869f < pp_Var6;
        pp_Var6 = (_func_int **)((ulong)pp_Var6 / 10000);
        uVar4 = __len + 4;
      } while (bVar2);
      __len = __len + 1;
    }
LAB_00169dfd:
    local_68 = local_58;
    local_48 = addr;
    std::__cxx11::string::_M_construct((ulong)&local_68,(char)__len - (char)((long)pp_Var1 >> 0x3f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)((long)local_68 - ((long)pp_Var1 >> 0x3f)),__len,(unsigned_long)__val);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x1abaa9);
    addr = local_48;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar7) {
      lVar3 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
  }
  if (local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    ir::dycGlobalReg((ir *)&local_68,addr);
    plVar5 = local_68;
    if (local_68 != (long *)0x0) {
      std::operator+(__return_storage_ptr__,"global:",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_68 + 1));
    }
    if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
    }
    if (plVar5 == (long *)0x0) {
      ir::dycLocalReg((ir *)&local_68,addr);
      plVar5 = local_68;
      if (local_68 != (long *)0x0) {
        std::operator+(__return_storage_ptr__,"local:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_68 + 1));
      }
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
      }
      if (plVar5 == (long *)0x0) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/local_value_numbering.cpp"
                      ,0x41,
                      "std::string mocker::LocalValueNumbering::hash(const std::shared_ptr<ir::Addr> &)"
                     );
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LocalValueNumbering::hash(const std::shared_ptr<ir::Addr> &addr) {
  if (auto p = ir::dyc<ir::IntLiteral>(addr))
    return "int:" + std::to_string(p->getVal());
  if (auto p = ir::dycGlobalReg(addr))
    return "global:" + p->getIdentifier();
  if (auto p = ir::dycLocalReg(addr))
    return "local:" + p->getIdentifier();
  assert(false);
}